

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O3

shared_ptr<MyCompiler::Program> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Program>(RecursiveDescentParser *this)

{
  istream *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var2;
  size_type sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Program> sVar5;
  string local_48;
  
  this->stream = (istream *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<MyCompiler::Program,std::allocator<MyCompiler::Program>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->currentToken,(Program **)this,
             (allocator<MyCompiler::Program> *)&local_48);
  parse<MyCompiler::Block>((RecursiveDescentParser *)&local_48);
  sVar3 = local_48._M_string_length;
  _Var2._M_p = local_48._M_dataplus._M_p;
  piVar1 = this->stream;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(piVar1 + 0x50);
  *(pointer *)(piVar1 + 0x48) = _Var2._M_p;
  *(size_type *)(piVar1 + 0x50) = sVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"period expected","");
  except(in_RSI,PERIOD,&local_48);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,(ulong)(local_48.field_2._M_allocated_capacity + 1));
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Program>)
         sVar5.super___shared_ptr<MyCompiler::Program,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Program> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Program>();

    pResult->pBlock = parse<Block>();
    except(SymbolType::PERIOD, "period expected");

    return pResult;
}